

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

void free_abbrevs(backtrace_state *state,abbrevs *abbrevs,backtrace_error_callback error_callback,
                 void *data)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  
  uVar1 = abbrevs->num_abbrevs;
  if (uVar1 != 0) {
    lVar2 = 0x18;
    uVar3 = 0;
    do {
      tcmalloc_backtrace_free
                (state,*(void **)((long)&abbrevs->abbrevs->code + lVar2),
                 *(long *)((long)abbrevs->abbrevs + lVar2 + -8) << 4,error_callback,data);
      uVar3 = uVar3 + 1;
      uVar1 = abbrevs->num_abbrevs;
      lVar2 = lVar2 + 0x20;
    } while (uVar3 < uVar1);
  }
  tcmalloc_backtrace_free(state,abbrevs->abbrevs,uVar1 << 5,error_callback,data);
  abbrevs->num_abbrevs = 0;
  abbrevs->abbrevs = (abbrev *)0x0;
  return;
}

Assistant:

static void
free_abbrevs (struct backtrace_state *state, struct abbrevs *abbrevs,
	      backtrace_error_callback error_callback, void *data)
{
  size_t i;

  for (i = 0; i < abbrevs->num_abbrevs; ++i)
    backtrace_free (state, abbrevs->abbrevs[i].attrs,
		    abbrevs->abbrevs[i].num_attrs * sizeof (struct attr),
		    error_callback, data);
  backtrace_free (state, abbrevs->abbrevs,
		  abbrevs->num_abbrevs * sizeof (struct abbrev),
		  error_callback, data);
  abbrevs->num_abbrevs = 0;
  abbrevs->abbrevs = NULL;
}